

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall anon_unknown.dwarf_50a29::Loop0Expr::parse_term(Loop0Expr *this,Context *con)

{
  uint uVar1;
  element_type *peVar2;
  undefined1 local_60 [8];
  ParsingState s;
  ParsingState st;
  Context *con_local;
  Loop0Expr *this_local;
  
  ParsingState::ParsingState((ParsingState *)&s.matches,con);
  peVar2 = std::__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_UnaryExpr).expr);
  uVar1 = (*peVar2->_vptr_Expr[3])(peVar2,con);
  if ((uVar1 & 1) == 0) {
    pegmatite::Context::restore(con,(ParsingState *)&s.matches);
  }
  else {
    do {
      ParsingState::ParsingState((ParsingState *)local_60,con);
      peVar2 = std::__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_UnaryExpr).expr);
      uVar1 = (*peVar2->_vptr_Expr[3])(peVar2,con);
    } while ((uVar1 & 1) != 0);
    pegmatite::Context::restore(con,(ParsingState *)local_60);
  }
  return true;
}

Assistant:

virtual bool parse_term(Context &con) const
	{
		//if parsing of the first fails, restore the context and stop
		ParsingState st(con);
		if (!expr->parse_term(con))
		{
			con.restore(st);
			return true;
		}

		//parse the rest until no more parsing is possible
		for(;;)
		{
			ParsingState s(con);
			if (!expr->parse_term(con))
			{
				con.restore(s);
				break;
			}
		}

		return true;
	}